

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_allocator.cpp
# Opt level: O3

IndexPointer __thiscall duckdb::FixedSizeAllocator::New(FixedSizeAllocator *this)

{
  unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true> *this_00;
  BlockManager *block_manager;
  _Head_base<0UL,_duckdb::FixedSizeBuffer_*,_false> this_01;
  ulong uVar1;
  uint32_t uVar2;
  _Head_base<0UL,_duckdb::FixedSizeBuffer_*,_false> this_02;
  mapped_type *pmVar3;
  iterator iVar4;
  pointer pFVar5;
  _Head_base<0UL,_unsigned_long_*,_false> __s;
  TemplatedValidityData<unsigned_long> *pTVar6;
  ulong uVar7;
  idx_t buffer_id_1;
  idx_t buffer_id;
  __node_gen_type __node_gen;
  idx_t local_60;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  _Head_base<0UL,_unsigned_long_*,_false> local_48;
  shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> local_40;
  ulong local_30;
  ulong local_28;
  
  if ((this->buffer_with_free_space).index == 0xffffffffffffffff) {
    local_60 = GetAvailableBufferId(this);
    block_manager = this->block_manager;
    this_02._M_head_impl = (FixedSizeBuffer *)operator_new(0x80);
    FixedSizeBuffer::FixedSizeBuffer(this_02._M_head_impl,block_manager);
    pmVar3 = ::std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->buffers,&local_60);
    this_01._M_head_impl =
         (pmVar3->
         super_unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::FixedSizeBuffer_*,_std::default_delete<duckdb::FixedSizeBuffer>_>
         .super__Head_base<0UL,_duckdb::FixedSizeBuffer_*,_false>._M_head_impl;
    (pmVar3->
    super_unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>_>)._M_t.
    super___uniq_ptr_impl<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::FixedSizeBuffer_*,_std::default_delete<duckdb::FixedSizeBuffer>_>
    .super__Head_base<0UL,_duckdb::FixedSizeBuffer_*,_false>._M_head_impl = this_02._M_head_impl;
    if (this_01._M_head_impl != (FixedSizeBuffer *)0x0) {
      FixedSizeBuffer::~FixedSizeBuffer(this_01._M_head_impl);
      operator_delete(this_01._M_head_impl);
    }
    local_48._M_head_impl = (unsigned_long *)&this->buffers_with_free_space;
    ::std::
    _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
              ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)local_48._M_head_impl,&local_60);
    optional_idx::optional_idx((optional_idx *)&local_48,local_60);
    (this->buffer_with_free_space).index = (idx_t)local_48._M_head_impl;
    iVar4 = ::std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->buffers)._M_h,&local_60);
    pFVar5 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
             ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                           *)((long)iVar4.
                                    super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
                                    ._M_cur + 0x10));
    __s._M_head_impl = (unsigned_long *)FixedSizeBuffer::Get(pFVar5,true);
    uVar1 = this->available_segments_per_buffer;
    local_40.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_40.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_30 = uVar1;
    if (__s._M_head_impl == (unsigned_long *)0x0) {
      local_48._M_head_impl = __s._M_head_impl;
      local_28 = uVar1;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                ((duckdb *)&local_58,&local_28);
      local_40.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = local_58;
      local_40.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Stack_50;
      pTVar6 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->(&local_40)
      ;
      __s._M_head_impl =
           (pTVar6->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
    }
    local_48._M_head_impl = __s._M_head_impl;
    if (uVar1 != 0) {
      uVar7 = uVar1 + 0x3f >> 6;
      if (uVar7 != 1) {
        switchD_01043a80::default(__s._M_head_impl,0xff,uVar7 * 8 - 8);
      }
      __s._M_head_impl[uVar7 - 1] =
           __s._M_head_impl[uVar7 - 1] |
           -(ulong)((uVar1 & 0x3f) == 0) | ~(-1L << ((byte)uVar1 & 0x3f));
    }
    if (local_40.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_40.internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  local_58 = (element_type *)optional_idx::GetIndex(&this->buffer_with_free_space);
  iVar4 = ::std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->buffers)._M_h,(key_type *)&local_58);
  this_00 = (unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
             *)((long)iVar4.
                      super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
                      ._M_cur + 0x10);
  pFVar5 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>::
           operator->(this_00);
  uVar2 = FixedSizeBuffer::GetOffset(pFVar5,this->bitmask_count,this->available_segments_per_buffer)
  ;
  this->total_segment_count = this->total_segment_count + 1;
  pFVar5 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>::
           operator->(this_00);
  pFVar5->segment_count = pFVar5->segment_count + 1;
  pFVar5 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>::
           operator->(this_00);
  if (pFVar5->segment_count == this->available_segments_per_buffer) {
    ::std::
    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_M_erase(&(this->buffers_with_free_space)._M_h,&local_58);
    if ((this->buffers_with_free_space)._M_h._M_element_count == 0) {
      local_48._M_head_impl = (unsigned_long *)0xffffffffffffffff;
    }
    else {
      optional_idx::optional_idx
                ((optional_idx *)&local_48,
                 (idx_t)(this->buffers_with_free_space)._M_h._M_before_begin._M_nxt[1]._M_nxt);
    }
    (this->buffer_with_free_space).index = (idx_t)local_48._M_head_impl;
  }
  return (IndexPointer)CONCAT44(uVar2,local_58._0_4_);
}

Assistant:

IndexPointer FixedSizeAllocator::New() {
	// No more free segments available.
	if (!buffer_with_free_space.IsValid()) {
		// Add a new buffer.
		auto buffer_id = GetAvailableBufferId();
		buffers[buffer_id] = make_uniq<FixedSizeBuffer>(block_manager);
		buffers_with_free_space.insert(buffer_id);
		buffer_with_free_space = buffer_id;

		// Set and initialize the bitmask of the new buffer.
		D_ASSERT(buffers.find(buffer_id) != buffers.end());
		auto &buffer = buffers.find(buffer_id)->second;
		ValidityMask mask(reinterpret_cast<validity_t *>(buffer->Get()), available_segments_per_buffer);
		mask.SetAllValid(available_segments_per_buffer);
	}

	// Extract an index pointer to a free segment.

	D_ASSERT(buffer_with_free_space.IsValid());
	auto buffer_id = buffer_with_free_space.GetIndex();

	D_ASSERT(buffers.find(buffer_id) != buffers.end());
	auto &buffer = buffers.find(buffer_id)->second;
	auto offset = buffer->GetOffset(bitmask_count, available_segments_per_buffer);

	total_segment_count++;
	buffer->segment_count++;

	// If the buffer is full, we cache the next buffer that we're going to fill.
	if (buffer->segment_count == available_segments_per_buffer) {
		buffers_with_free_space.erase(buffer_id);
		NextBufferWithFreeSpace();
	}

	return IndexPointer(uint32_t(buffer_id), offset);
}